

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_core.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int epfd;
  int iVar2;
  int *piVar3;
  int local_30ac;
  int n;
  int nfds;
  int epollfd;
  uint16_t listen_port;
  int listen_fd;
  pthread_t tid;
  _epollfd_connfd epollfd_connfd;
  pthread_attr_t pthread_attr_detach;
  undefined1 local_3048 [4];
  socklen_t addrlen;
  sockaddr_in client_addr;
  sockaddr_in server_addr;
  epoll_event events [1024];
  epoll_event ev;
  int conn_sock;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    printf("Usage: %s <config_path>\n",*argv);
    exit(-1);
  }
  iVar1 = going_is_file_existed(argv[1]);
  if (iVar1 == -1) {
    perror("going_is_file_existed.");
    exit(-1);
  }
  iVar1 = going_parse_config(argv[1]);
  if (iVar1 == -1) {
    printf("going_parse_config error!\n");
    exit(-1);
  }
  iVar1 = going_socket(2,1,0);
  going_set_nonblocking(iVar1);
  going_set_reuse_addr(iVar1);
  memset(client_addr.sin_zero,0,0x10);
  client_addr.sin_zero[0] = '\x02';
  client_addr.sin_zero[1] = '\0';
  client_addr.sin_zero[2] = 'P';
  client_addr.sin_zero[3] = '\0';
  client_addr.sin_zero._4_4_ = htonl(0);
  going_bind(iVar1,(sockaddr *)client_addr.sin_zero,0x10);
  going_listen(iVar1,100);
  epfd = going_epoll_create(0x400);
  events[0x3ff].data.fd = 1;
  events[0x3ff].data._4_4_ = iVar1;
  going_epoll_add(epfd,iVar1,(epoll_event *)&events[0x3ff].data);
  pthread_attr_init((pthread_attr_t *)&epollfd_connfd);
  pthread_attr_setdetachstate((pthread_attr_t *)&epollfd_connfd,1);
LAB_0010ebd2:
  iVar2 = going_epoll_wait(epfd,(epoll_event *)server_addr.sin_zero,0x400,-1);
  if (iVar2 == -1) goto code_r0x0010ebfd;
  goto LAB_0010ec09;
code_r0x0010ebfd:
  piVar3 = __errno_location();
  if (*piVar3 != 4) {
LAB_0010ec09:
    for (local_30ac = 0; local_30ac != iVar2; local_30ac = local_30ac + 1) {
      if (*(int *)((long)&events[(long)local_30ac + -1].data + 4) == iVar1) {
        ev.data.fd = going_accept(iVar1,(sockaddr *)local_3048,
                                  (socklen_t *)(pthread_attr_detach.__size + 0x34));
        going_set_nonblocking(ev.data.fd);
        events[0x3ff].data.fd = -0x7fffffff;
        events[0x3ff].data._4_4_ = ev.data.fd;
        going_epoll_add(epfd,ev.data.fd,(epoll_event *)&events[0x3ff].data);
      }
      else {
        tid._4_4_ = *(undefined4 *)((long)&events[(long)local_30ac + -1].data + 4);
        events[0x3ff].data.u64._4_4_ = ev.data.fd;
        tid._0_4_ = epfd;
        going_epoll_del(epfd,ev.data.fd,(epoll_event *)&events[0x3ff].data);
        pthread_create((pthread_t *)&stack0xffffffffffffcf68,(pthread_attr_t *)&epollfd_connfd,
                       going_thread_func,&tid);
      }
    }
  }
  goto LAB_0010ebd2;
}

Assistant:

int main(int argc, char const *argv[])
{
	int    			   conn_sock;
	struct epoll_event ev;
	struct epoll_event events[MAXEVENTS];
	struct sockaddr_in server_addr;
	struct sockaddr_in client_addr;
	socklen_t          addrlen;
	pthread_attr_t     pthread_attr_detach;
	_epollfd_connfd    epollfd_connfd;
	pthread_t          tid;

	if(argc != 2){
		printf("Usage: %s <config_path>\n", argv[0]);
		exit(-1);
	}
	//Is configure existed?
	if(-1 == going_is_file_existed(argv[1])){
		perror("going_is_file_existed.");
		exit(-1);
	}
	//parse configure
	if(-1 == going_parse_config(argv[1])){
		printf("going_parse_config error!\n");
		exit(-1);
	}

	//创建监听套接字
	int listen_fd = going_socket(AF_INET, SOCK_STREAM, 0);
	//设置监听套接字为非阻塞模式
	going_set_nonblocking(listen_fd);
	//对套接字设置SO_REUSEADDR选项
	going_set_reuse_addr(listen_fd);


	//通过服务名和协议名获得相应的知名端口
	//struct servent* pservent = going_getservbyname("http", "tcp");
	//uint16_t listen_port = pservent->s_port;
	
	uint16_t listen_port = 80;

	bzero(&server_addr, sizeof(server_addr));
	server_addr.sin_family = AF_INET;
	server_addr.sin_port = (listen_port);
	server_addr.sin_addr.s_addr = htonl(INADDR_ANY);

	going_bind(listen_fd, (struct sockaddr*)&server_addr, sizeof(server_addr));
	going_listen(listen_fd, MAX_BACKLOG);

	// 创建epoll文件描述符
	int epollfd = going_epoll_create(MAXEVENTS);

	// 设置要处理的事件类型
	ev.events = EPOLLIN;
	// 设置与要处理的事件相关的文件描述符
	ev.data.fd = listen_fd;
	// 将监听事件加入epoll中
	going_epoll_add(epollfd, listen_fd, &ev);

	//设置线程属性为detach
	pthread_attr_init(&pthread_attr_detach);
	pthread_attr_setdetachstate(&pthread_attr_detach, PTHREAD_CREATE_DETACHED);

	for(;;){
		// 无限等待直到有描述符就绪
		int nfds = going_epoll_wait(epollfd, events, MAXEVENTS, -1);
		// 若going_epoll_wait被中断则重新调用该函数
		if(nfds == -1 && errno == EINTR)
			continue;

		for(int n = 0; n != nfds; ++n){
			// 处理监听套接字触发的事件
			if(events[n].data.fd == listen_fd){
				conn_sock = going_accept(listen_fd, (struct sockaddr *)&client_addr, &addrlen);
				// 设置新连接上的套接字为非阻塞模式
				going_set_nonblocking(conn_sock);
				// 设置读事件和ET模式
				ev.events = EPOLLIN | EPOLLET;
				ev.data.fd = conn_sock;
				// 将监听事件添加到epoll
				going_epoll_add(epollfd, conn_sock, &ev);
			}else{
				epollfd_connfd.epollfd = epollfd;
				epollfd_connfd.connfd = events[n].data.fd;
				ev.data.fd = conn_sock;
				// epoll不再监听这个事件
				going_epoll_del(epollfd, conn_sock, &ev);
				// 处理连接
				pthread_create(&tid, &pthread_attr_detach, &going_thread_func, (void *)&epollfd_connfd);
			}
		}
	}

	pthread_attr_destroy(&pthread_attr_detach);

	// 关闭监听描述符
	close(listen_fd);
	return 0;
}